

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O3

void pnga_fence(void)

{
  Integer IVar1;
  long lVar2;
  char *__s;
  
  if (GA_fence_set < 1) {
    pnga_error("ga_fence: fence not initialized",0);
  }
  GA_fence_set = GA_fence_set + -1;
  IVar1 = GAnproc;
  __s = fence_array;
  if (0 < GAnproc) {
    lVar2 = 0;
    do {
      if (__s[lVar2] != '\0') {
        ARMCI_Fence((int)lVar2);
        IVar1 = GAnproc;
        __s = fence_array;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < IVar1);
  }
  memset(__s,0,(long)(int)IVar1);
  return;
}

Assistant:

void pnga_fence()
{
    int proc;
    if(GA_fence_set<1)pnga_error("ga_fence: fence not initialized",0);
    GA_fence_set--;
    for(proc=0;proc<GAnproc;proc++)if(fence_array[proc])ARMCI_Fence(proc);
    bzero(fence_array,(int)GAnproc);
}